

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiPayload *this;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiID IVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *this_00;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2c37,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount != -1) {
    pIVar5 = GImGui->CurrentWindow;
    this = &GImGui->DragDropPayload;
    if ((type == (char *)0x0) || (bVar7 = ImGuiPayload::IsDataType(this,type), bVar7)) {
      IVar3 = pIVar6->DragDropAcceptIdPrev;
      IVar4 = pIVar6->DragDropTargetId;
      IVar1 = (pIVar6->DragDropTargetRect).Min;
      IVar2 = (pIVar6->DragDropTargetRect).Max;
      fVar8 = IVar2.x;
      fVar9 = IVar2.y;
      fVar10 = IVar1.x;
      fVar11 = IVar1.y;
      fVar12 = (fVar9 - fVar11) * (fVar8 - fVar10);
      if (fVar12 <= pIVar6->DragDropAcceptIdCurrRectSurface) {
        pIVar6->DragDropAcceptFlags = flags;
        pIVar6->DragDropAcceptIdCurr = IVar4;
        pIVar6->DragDropAcceptIdCurrRectSurface = fVar12;
      }
      (pIVar6->DragDropPayload).Preview = IVar3 == IVar4;
      if (((pIVar6->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar4) {
        this_00 = pIVar5->DrawList;
        local_38.x = fVar10 + -3.5;
        local_38.y = fVar11 + -3.5;
        local_40.x = fVar8 + 3.5;
        local_40.y = fVar9 + 3.5;
        col = GetColorU32(0x30,1.0);
        ImDrawList::AddRect(this_00,&local_38,&local_40,col,0.0,0,2.0);
      }
      pIVar6->DragDropAcceptFrameCount = pIVar6->FrameCount;
      if (IVar3 == IVar4) {
        bVar7 = IsMouseDown(pIVar6->DragDropMouseButton);
        (pIVar6->DragDropPayload).Delivery = !bVar7;
        if (((uint)flags >> 10 & 1) != 0 || !bVar7) {
          return this;
        }
      }
      else {
        (pIVar6->DragDropPayload).Delivery = false;
        if (((uint)flags >> 10 & 1) != 0) {
          return this;
        }
      }
    }
    return (ImGuiPayload *)0x0;
  }
  __assert_fail("payload.DataFrameCount != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x2c38,
                "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
               );
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}